

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv__io_check_fd(uv_loop_t *loop,int fd)

{
  int iVar1;
  int *piVar2;
  int local_24;
  undefined1 local_20 [4];
  int rc;
  uv__epoll_event e;
  int fd_local;
  uv_loop_t *loop_local;
  
  local_20 = (undefined1  [4])0x1;
  _rc = 0xffffffffffffffff;
  local_24 = 0;
  e.data._0_4_ = fd;
  unique0x100000a9 = loop;
  iVar1 = uv__epoll_ctl(loop->backend_fd,1,fd,(uv__epoll_event *)local_20);
  if ((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 != 0x11)) {
    piVar2 = __errno_location();
    local_24 = -*piVar2;
  }
  if ((local_24 == 0) &&
     (iVar1 = uv__epoll_ctl(stack0xfffffffffffffff0->backend_fd,2,(int)e.data,
                            (uv__epoll_event *)local_20), iVar1 != 0)) {
    abort();
  }
  return local_24;
}

Assistant:

int uv__io_check_fd(uv_loop_t* loop, int fd) {
  struct uv__epoll_event e;
  int rc;

  e.events = POLLIN;
  e.data = -1;

  rc = 0;
  if (uv__epoll_ctl(loop->backend_fd, UV__EPOLL_CTL_ADD, fd, &e))
    if (errno != EEXIST)
      rc = -errno;

  if (rc == 0)
    if (uv__epoll_ctl(loop->backend_fd, UV__EPOLL_CTL_DEL, fd, &e))
      abort();

  return rc;
}